

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O1

void __thiscall pktalloc::Allocator::Allocator(Allocator *this)

{
  uint i;
  void *pvVar1;
  WindowHeader *pWVar2;
  long lVar3;
  uint uVar4;
  WindowHeader *window;
  
  this->HugeChunkStart = (uint8_t *)0x0;
  pWVar2 = (WindowHeader *)0x0;
  (this->PreferredWindows).Size = 0;
  (this->PreferredWindows).Allocated = 0x19;
  (this->PreferredWindows).DataPtr = (this->PreferredWindows).PreallocatedData;
  (this->FullWindows).Size = 0;
  (this->FullWindows).Allocated = 0x19;
  (this->FullWindows).DataPtr = (this->FullWindows).PreallocatedData;
  LightVector<pktalloc::Allocator::WindowHeader_*>::SetSize_NoCopy(&this->PreferredWindows,2);
  pvVar1 = calloc(1,0x20260);
  if (pvVar1 != (void *)0x0) {
    uVar4 = (uint)pvVar1 & 0x1f;
    *(char *)((long)pvVar1 + (0x1f - (ulong)uVar4)) = (char)uVar4;
    pWVar2 = (WindowHeader *)((long)pvVar1 + (0x20 - (ulong)uVar4));
  }
  this->HugeChunkStart = (uint8_t *)pWVar2;
  if (pWVar2 != (WindowHeader *)0x0) {
    lVar3 = 0;
    do {
      *(undefined8 *)&pWVar2->field_0xc0 = 0;
      *(undefined8 *)&pWVar2->field_0xc8 = 0;
      *(undefined8 *)&pWVar2->field_0xd0 = 0;
      *(undefined8 *)&pWVar2->field_0xd8 = 0;
      *(undefined8 *)&pWVar2->field_0xe0 = 0;
      *(undefined8 *)&pWVar2->field_0xe8 = 0;
      *(undefined8 *)&pWVar2->field_0xf0 = 0;
      *(undefined8 *)&pWVar2->field_0xf8 = 0;
      *(undefined8 *)&pWVar2->field_0x80 = 0;
      *(undefined8 *)&pWVar2->field_0x88 = 0;
      *(undefined8 *)&pWVar2->field_0x90 = 0;
      *(undefined8 *)&pWVar2->field_0x98 = 0;
      *(undefined8 *)&pWVar2->field_0xa0 = 0;
      *(undefined8 *)&pWVar2->field_0xa8 = 0;
      *(undefined8 *)&pWVar2->field_0xb0 = 0;
      *(undefined8 *)&pWVar2->field_0xb8 = 0;
      *(undefined8 *)&pWVar2->field_0x40 = 0;
      *(undefined8 *)&pWVar2->field_0x48 = 0;
      *(undefined8 *)&pWVar2->field_0x50 = 0;
      *(undefined8 *)&pWVar2->field_0x58 = 0;
      *(undefined8 *)&pWVar2->field_0x60 = 0;
      *(undefined8 *)&pWVar2->field_0x68 = 0;
      *(undefined8 *)&pWVar2->field_0x70 = 0;
      *(undefined8 *)&pWVar2->field_0x78 = 0;
      *(undefined8 *)pWVar2 = 0;
      *(undefined8 *)&pWVar2->field_0x8 = 0;
      *(undefined8 *)&pWVar2->field_0x10 = 0;
      *(undefined8 *)&pWVar2->field_0x18 = 0;
      *(undefined8 *)&pWVar2->field_0x20 = 0;
      *(undefined8 *)&pWVar2->field_0x28 = 0;
      *(undefined8 *)&pWVar2->field_0x30 = 0;
      *(undefined8 *)&pWVar2->field_0x38 = 0;
      pWVar2->FreeUnitCount = 0x800;
      pWVar2->ResumeScanOffset = 0;
      pWVar2->Preallocated = true;
      pWVar2->FullListIndex = -1;
      (this->PreferredWindows).DataPtr[lVar3] = pWVar2;
      lVar3 = lVar3 + 1;
      pWVar2 = pWVar2 + 0xf2;
    } while (lVar3 == 1);
  }
  return;
}

Assistant:

Allocator::Allocator()
{
    static_assert(kAlignmentBytes == kUnitSize, "update SIMDSafeAllocate");

    PreferredWindows.SetSize_NoCopy(kPreallocatedWindows);

    HugeChunkStart = SIMDSafeAllocate(kWindowSizeBytes * kPreallocatedWindows);
    if (HugeChunkStart)
    {
        uint8_t* windowStart = HugeChunkStart;

        // For each window to preallocate:
        for (unsigned i = 0; i < kPreallocatedWindows; ++i)
        {
            WindowHeader* window = (WindowHeader*)windowStart;
            windowStart += kWindowSizeBytes;

            window->Used.ClearAll();
            window->FreeUnitCount = kWindowMaxUnits;
            window->ResumeScanOffset = 0;
            window->Preallocated = true;
            window->FullListIndex = kNotInFullList;

            PreferredWindows.GetRef(i) = window;
        }
    }

    ALLOC_DEBUG_INTEGRITY_CHECK();
}